

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifndef_guard.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::cpp::(anonymous_namespace)::MakeIfdefGuardIdentifier_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view header_path)

{
  string result;
  long *local_120;
  size_t local_118;
  long local_110 [2];
  long *local_100;
  long local_f8;
  long local_f0 [2];
  undefined8 local_e0;
  char *local_d8;
  AlphaNum local_b0;
  undefined8 local_80;
  char *local_78;
  undefined8 local_70;
  char *local_68;
  undefined8 local_60;
  char *local_58;
  undefined8 local_50;
  char *local_48;
  undefined8 local_40;
  char *local_38;
  undefined8 local_30;
  char *local_28;
  
  local_80 = 1;
  local_78 = "/";
  local_70 = 1;
  local_68 = "_";
  local_60 = 1;
  local_58 = ".";
  local_50 = 1;
  local_48 = "_";
  local_40 = 1;
  local_38 = "-";
  local_30 = 1;
  local_28 = "_";
  absl::lts_20240722::StrReplaceAll_abi_cxx11_(&local_100,this,header_path._M_len,&local_80,3);
  local_120 = local_110;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_120,local_100,local_f8 + (long)local_100);
  absl::lts_20240722::AsciiStrToUpper((string *)&local_120);
  local_b0.piece_._M_len = local_118;
  local_b0.piece_._M_str = (char *)local_120;
  local_e0 = 1;
  local_d8 = "_";
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_b0);
  if (local_120 != local_110) {
    operator_delete(local_120,local_110[0] + 1);
  }
  if (local_100 != local_f0) {
    operator_delete(local_100,local_f0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MakeIfdefGuardIdentifier(const absl::string_view header_path) {
  return absl::StrCat(absl::AsciiStrToUpper(absl::StrReplaceAll(header_path,
                                                                {
                                                                    {"/", "_"},
                                                                    {".", "_"},
                                                                    {"-", "_"},
                                                                })),
                      "_");
}